

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRuntimeFail.cpp
# Opt level: O0

void __thiscall Test_testGlobalOverflow::~Test_testGlobalOverflow(Test_testGlobalOverflow *this)

{
  Test_testGlobalOverflow *this_local;
  
  ~Test_testGlobalOverflow(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

virtual void Run()
	{
		nullcClean();
		nullcSetExecutorStackSize(32 * 1024);

		if(Tests::messageVerbose)
			printf("Global overflow test\r\n");

		if(Tests::testFailureExecutor[TEST_TYPE_X86])
		{
			testsCount[TEST_TYPE_X86]++;
			nullcSetExecutor(NULLC_X86);
			nullres good = nullcBuild(testGlobalOverflow);
			assert(good);
			good = nullcRun();
			if(!good)
			{
				const char *expected = "ERROR: allocated stack overflow";
				char buf[512];

				if(const char *pos = strstr(nullcGetLastError(), "ERROR:"))
					strncpy(buf, pos, 511);
				else
					strncpy(buf, nullcGetLastError(), 511);

				buf[511] = 0;

				if(char *lineEnd = strchr(buf, '\r'))
					*lineEnd = 0;
				if(strcmp(expected, buf) != 0)
				{
					if(!Tests::messageVerbose)
						printf("Global overflow test\r\n");
					printf("X86 failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", buf, expected);
				}else{
					testsPassed[TEST_TYPE_X86]++;
				}
			}else{
				if(!Tests::messageVerbose)
					printf("Global overflow test\r\n");
				printf("Test should have failed.\r\n");
			}
		}

		nullcClean();
		nullcSetExecutorStackSize(Tests::testStackSize);
	}